

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
spirv_cross::Compiler::register_global_read_dependencies
          (Compiler *this,SPIRFunction *func,uint32_t id)

{
  TypedID<(spirv_cross::Types)6> *pTVar1;
  size_t sVar2;
  SPIRBlock *block;
  long lVar3;
  
  pTVar1 = (func->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr;
  sVar2 = (func->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.buffer_size;
  for (lVar3 = 0; sVar2 << 2 != lVar3; lVar3 = lVar3 + 4) {
    block = get<spirv_cross::SPIRBlock>(this,*(uint32_t *)((long)&pTVar1->id + lVar3));
    register_global_read_dependencies(this,block,id);
  }
  return;
}

Assistant:

void Compiler::register_global_read_dependencies(const SPIRFunction &func, uint32_t id)
{
	for (auto block : func.blocks)
		register_global_read_dependencies(get<SPIRBlock>(block), id);
}